

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dec_util.c
# Opt level: O0

u8 dec_is_separate_tree(int w,int h,com_split_mode_t split)

{
  bool local_1a;
  bool local_19;
  com_split_mode_t split_local;
  int h_local;
  int w_local;
  
  if (split == SPLIT_QUAD) {
    h_local._3_1_ = w == 8;
  }
  else if (split == SPLIT_EQT_HOR) {
    local_19 = h == 0x10 || w == 8;
    h_local._3_1_ = local_19;
  }
  else if (split == SPLIT_EQT_VER) {
    local_1a = w == 0x10 || h == 8;
    h_local._3_1_ = local_1a;
  }
  else if (split == SPLIT_BI_HOR) {
    h_local._3_1_ = h == 8;
  }
  else if (split == SPLIT_BI_VER) {
    h_local._3_1_ = w == 8;
  }
  else {
    h_local._3_1_ = false;
  }
  return h_local._3_1_;
}

Assistant:

u8 dec_is_separate_tree(int w, int h, com_split_mode_t split)
{
    if (split == SPLIT_QUAD) {
        return (w == 8);
    }
    else if (split == SPLIT_EQT_HOR) {
        return (h == 16 || w == 8);
    }
    else if (split == SPLIT_EQT_VER) {
        return (w == 16 || h == 8);
    }
    else if (split == SPLIT_BI_HOR) {
        return (h == 8);
    }
    else if (split == SPLIT_BI_VER) {
        return (w == 8);
    }
    else {
        return 0;
    }
}